

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32
laszip_has_spatial_index(laszip_POINTER pointer,laszip_BOOL *is_indexed,laszip_BOOL *is_appended)

{
  laszip_dll_struct *laszip_dll;
  laszip_BOOL *is_appended_local;
  laszip_BOOL *is_indexed_local;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else if (is_indexed == (laszip_BOOL *)0x0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"laszip_BOOL pointer \'is_indexed\' is zero");
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x228) == 0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"reader is not open");
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x238) == 0) {
    if ((*(byte *)((long)pointer + 0xa7a) & 1) == 0) {
      snprintf((char *)((long)pointer + 0x248),0x400,
               "exploiting of spatial indexing not enabled before opening reader");
      pointer_local._4_4_ = 1;
    }
    else {
      if (*(long *)((long)pointer + 0xa48) == 0) {
        *is_indexed = 0;
      }
      else {
        *is_indexed = 1;
      }
      if (is_appended != (laszip_BOOL *)0x0) {
        *is_appended = 0;
      }
      *(undefined1 *)((long)pointer + 0x248) = 0;
      pointer_local._4_4_ = 0;
    }
  }
  else {
    snprintf((char *)((long)pointer + 0x248),0x400,"writer is already open");
    pointer_local._4_4_ = 1;
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_has_spatial_index(
    laszip_POINTER                     pointer
    , laszip_BOOL*                     is_indexed
    , laszip_BOOL*                     is_appended
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (is_indexed == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_BOOL pointer 'is_indexed' is zero");
      return 1;
    }

    if (laszip_dll->reader == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is not open");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    if (laszip_dll->lax_exploit == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "exploiting of spatial indexing not enabled before opening reader");
      return 1;
    }

    // check if reader found spatial indexing information when opening file

    if (laszip_dll->lax_index)
    {
      *is_indexed = 1;
    }
    else
    {
      *is_indexed = 0;
    }

    // optional: inform whether spatial index is appended to LAZ file or in separate LAX file

    if (is_appended)
    {
      *is_appended = 0;
    }

  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_have_spatial_index");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}